

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(TiledRgbaInputFile *this,char *name,int numThreads)

{
  RgbaChannels RVar1;
  allocator<char> *__a;
  void *pvVar2;
  undefined8 *in_RDI;
  int in_stack_000001d4;
  char *in_stack_000001d8;
  TiledInputFile *in_stack_000001e0;
  TiledRgbaInputFile *in_stack_ffffffffffffffa0;
  TiledInputFile *in_stack_ffffffffffffffd8;
  FromYa *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__TiledRgbaInputFile_005627b0;
  __a = (allocator<char> *)operator_new(0x10);
  TiledInputFile::TiledInputFile(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  in_RDI[1] = __a;
  in_RDI[2] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
  RVar1 = channels(in_stack_ffffffffffffffa0);
  if ((RVar1 & WRITE_Y) != 0) {
    pvVar2 = operator_new(0x78);
    FromYa::FromYa(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (const char name[], int numThreads):
    _inputFile (new TiledInputFile (name, numThreads)),
    _fromYa (0),
    _channelNamePrefix ("")
{
    if (channels() & WRITE_Y)
	_fromYa = new FromYa (*_inputFile);
}